

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rootindexproxymodel.cpp
# Opt level: O0

void __thiscall tst_RootIndexProxyModel::showRoot_data(tst_RootIndexProxyModel *this)

{
  QAbstractItemModel *pQVar1;
  QTestData *pQVar2;
  QModelIndex local_b0;
  undefined1 local_98 [24];
  QModelIndex local_80;
  QModelIndex local_68;
  QModelIndex local_50;
  QAbstractItemModel *local_38;
  QAbstractItemModel *baseModel;
  QAbstractItemModel *local_18;
  tst_RootIndexProxyModel *local_10;
  tst_RootIndexProxyModel *this_local;
  
  local_10 = this;
  QTest::addColumn<QAbstractItemModel*>("baseModel",(QAbstractItemModel **)0x0);
  QTest::addColumn<QModelIndex>("root",(QModelIndex *)0x0);
  pQVar2 = (QTestData *)QTest::newRow("Parent");
  local_18 = createTreeModel((QObject *)0x0);
  pQVar2 = operator<<(pQVar2,&local_18);
  QModelIndex::QModelIndex((QModelIndex *)&baseModel);
  operator<<(pQVar2,(QModelIndex *)&baseModel);
  local_38 = createTreeModel((QObject *)0x0);
  pQVar2 = (QTestData *)QTest::newRow("Child");
  pQVar2 = operator<<(pQVar2,&local_38);
  pQVar1 = local_38;
  QModelIndex::QModelIndex(&local_68);
  (**(code **)(*(long *)pQVar1 + 0x60))(&local_50,pQVar1,1,0,&local_68);
  operator<<(pQVar2,&local_50);
  local_38 = createTreeModel((QObject *)0x0);
  pQVar2 = (QTestData *)QTest::newRow("Grandchild");
  pQVar2 = operator<<(pQVar2,&local_38);
  pQVar1 = local_38;
  QModelIndex::QModelIndex(&local_b0);
  (**(code **)(*(long *)pQVar1 + 0x60))(local_98,pQVar1,1,0,&local_b0);
  (**(code **)(*(long *)pQVar1 + 0x60))(&local_80,pQVar1,2,0,local_98);
  operator<<(pQVar2,&local_80);
  return;
}

Assistant:

void tst_RootIndexProxyModel::showRoot_data()
{
#ifdef COMPLEX_MODEL_SUPPORT
    QTest::addColumn<QAbstractItemModel *>("baseModel");
    QTest::addColumn<QModelIndex>("root");
    QTest::newRow("Parent") << createTreeModel(nullptr) << QModelIndex();
    QAbstractItemModel *baseModel = createTreeModel(nullptr);
    QTest::newRow("Child") << baseModel << baseModel->index(1, 0);
    baseModel = createTreeModel(nullptr);
    QTest::newRow("Grandchild") << baseModel << baseModel->index(2, 0, baseModel->index(1, 0));
#else
    QSKIP("This test requires the Qt GUI or GenericModel modules");
#endif
}